

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O0

void runnable_function(void *arg,size_t argsz)

{
  void *result_00;
  void *result;
  _func_void_ptr_void_ptr_size_t_size_t_ptr *callFunc;
  size_t result_size;
  wrap_t *wrapper;
  size_t argsz_local;
  void *arg_local;
  
  callFunc = (_func_void_ptr_void_ptr_size_t_size_t_ptr *)0x0;
  result_size = (size_t)arg;
  wrapper = (wrap_t *)argsz;
  argsz_local = (size_t)arg;
  result_00 = (void *)(**arg)(*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x10),
                              &callFunc);
  future_set(*(future_t **)(result_size + 0x18),result_00,(size_t)callFunc);
  free(*(void **)(result_size + 0x20));
  free((void *)result_size);
  return;
}

Assistant:

void runnable_function(void *arg, size_t argsz __attribute__ ((unused))) {
    wrap_t *wrapper = arg;
    size_t result_size = 0;

    void *(*callFunc)(void *, size_t, size_t *) = wrapper->callable.function;
    void *result = callFunc(wrapper->callable.arg, wrapper->callable.argsz, &result_size);

    future_set(wrapper->future, result, result_size);

    free(wrapper->runnable);
    free(wrapper);
}